

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

void (anonymous_namespace)::
     roundtrip_into<std::__cxx11::list<int,std::allocator<int>>,std::__cxx11::list<int,std::allocator<int>>>
               (list<int,_std::allocator<int>_> *in,list<int,_std::allocator<int>_> *out)

{
  InputStream *istream_00;
  Enum EVar1;
  Expression_lhs<unsigned_long> EVar2;
  InputStream istream;
  OutputStream ostream;
  stringstream stream;
  OutputStream *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  fpos local_200 [16];
  streamoff local_1f0;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Enum local_1d8;
  unsigned_long *in_stack_fffffffffffffe40;
  Expression_lhs<unsigned_long> *in_stack_fffffffffffffe48;
  long local_198 [13];
  Result *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  Enum in_stack_fffffffffffffef4;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios::exceptions((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  mserialize::serialize<std::__cxx11::list<int,std::allocator<int>>,OutputStream>
            ((list<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_200 = (fpos  [16])std::ostream::tellp();
  local_1f0 = std::fpos::operator_cast_to_long(local_200);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (unsigned_long *)in_stack_fffffffffffffdb8);
  local_1e0 = EVar2.lhs;
  EVar1 = EVar2.m_at;
  local_1d8 = EVar1;
  istream_00 = (InputStream *)
               mserialize::serialized_size<std::__cxx11::list<int,std::allocator<int>>>
                         ((list<int,_std::allocator<int>_> *)0x146143);
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  doctest::detail::decomp_assert
            (in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  doctest::detail::Result::~Result((Result *)0x146196);
  mserialize::deserialize<std::__cxx11::list<int,std::allocator<int>>,InputStream>
            ((list<int,_std::allocator<int>_> *)CONCAT44(EVar1,in_stack_fffffffffffffdc0),istream_00
            );
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return;
}

Assistant:

void roundtrip_into(const In& in, Out& out)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // make sure computed serialized size is correct
  CHECK(std::size_t(stream.tellp()) == mserialize::serialized_size(in));

  // deserialize
  InputStream istream{stream};
  mserialize::deserialize(out, istream);
}